

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db.c
# Opt level: O3

void load_rooms(FILE *fp)

{
  double dVar1;
  char cVar2;
  char cVar3;
  int iVar4;
  uint uVar5;
  ROOM_INDEX_DATA *pRVar6;
  char *pcVar7;
  EXIT_DATA *pEVar8;
  size_t sVar9;
  TRAP_DATA *pTVar10;
  EXTRA_DESCR_DATA *pEVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  char error_v [4608];
  short local_124c;
  char local_1249;
  long *local_1248;
  EXIT_DATA **local_1240;
  char local_1238 [4616];
  
  if (area_last == (AREA_DATA_conflict *)0x0) {
    bugout("Load_resets: no #AREA seen yet.");
  }
  local_124c = 0;
  local_1249 = fread_letter(fp);
  if (local_1249 != '#') {
LAB_00281896:
    fmt._M_str = "Letter is {}.";
    fmt._M_len = 0xd;
    CLogger::Error<char&>((CLogger *)&RS.field_0x140,fmt,&local_1249);
    fmt_00._M_str = "Load_newrooms: # not found, last vnum {}.";
    fmt_00._M_len = 0x29;
    CLogger::Error<short&>((CLogger *)&RS.field_0x140,fmt_00,&local_124c);
    exit(0);
  }
  local_1249 = '#';
LAB_00281310:
  iVar4 = fread_number(fp);
  local_124c = (short)iVar4;
  if (local_124c == 0) {
    return;
  }
  fBootDb = false;
  pRVar6 = get_room_index(0);
  if (pRVar6 != (ROOM_INDEX_DATA *)0x0) {
    sprintf(local_1238,"Load_rooms: vnum %d duplicated.",(ulong)(uint)(int)local_124c);
    bugout(local_1238);
  }
  fBootDb = true;
  pRVar6 = (ROOM_INDEX_DATA *)operator_new(0x1c0);
  pRVar6->reset_first = (RESET_DATA *)0x0;
  pRVar6->reset_last = (RESET_DATA *)0x0;
  pcVar7 = palloc_string("");
  pRVar6->owner = pcVar7;
  pRVar6->move_progs = false;
  pRVar6->alt_description = (char *)0x0;
  pRVar6->alt_description_cond = 0;
  pRVar6->alt_name = (char *)0x0;
  pRVar6->trap = (TRAP_DATA *)0x0;
  pRVar6->affected = (ROOM_AFFECT_DATA *)0x0;
  local_1248 = pRVar6->room_flags;
  pRVar6->people = (CHAR_DATA *)0x0;
  pRVar6->contents = (OBJ_DATA *)0x0;
  pRVar6->extra_descr = (EXTRA_DESCR_DATA *)0x0;
  zero_vector(local_1248);
  lVar14 = 0xd;
  do {
    pEVar8 = (EXIT_DATA *)new_track_data();
    pRVar6->exit[lVar14 + -7] = pEVar8;
    lVar14 = lVar14 + 1;
  } while (lVar14 != 0x11);
  pRVar6->area = area_last;
  pRVar6->vnum = local_124c;
  pcVar7 = fread_string(fp);
  pRVar6->name = pcVar7;
  sVar9 = strlen(pcVar7);
  if (pcVar7[sVar9 - 1] == '.') {
    chop(pcVar7);
  }
  pcVar7 = fread_string(fp);
  pRVar6->description = pcVar7;
  fread_word(fp);
  iVar4 = sect_lookup(fread_word::word);
  pRVar6->sector_type = (short)sect_table[iVar4].value;
  pRVar6->rprogs = (RPROG_DATA *)0x0;
  zero_vector(pRVar6->progtypes);
  pRVar6->cabal = 0;
  pRVar6->has_rune = false;
  zero_vector(pRVar6->affected_by);
  if (pRVar6->area->area_type == 6) {
    *(byte *)((long)local_1248 + 2) = *(byte *)((long)local_1248 + 2) | 0xd0;
  }
  local_1240 = pRVar6->exit;
  pRVar6->exit[4] = (EXIT_DATA *)0x0;
  pRVar6->exit[5] = (EXIT_DATA *)0x0;
  pRVar6->exit[2] = (EXIT_DATA *)0x0;
  pRVar6->exit[3] = (EXIT_DATA *)0x0;
  pRVar6->exit[0] = (EXIT_DATA *)0x0;
  pRVar6->exit[1] = (EXIT_DATA *)0x0;
  pRVar6->heal_rate = 100;
  pRVar6->mana_rate = 100;
  pRVar6->light = 0;
  do {
    cVar2 = fread_letter(fp);
    cVar3 = cVar2 + -0x20;
    if (0x19 < (byte)(cVar2 + 0x9fU)) {
      cVar3 = cVar2;
    }
    switch(cVar3) {
    case 'A':
      fread_word(fp);
      iVar4 = fread_number(fp);
      pRVar6->alt_description_cond = (short)iVar4;
      pcVar7 = fread_string(fp);
      pRVar6->alt_name = pcVar7;
      pcVar7 = fread_string(fp);
      pRVar6->alt_description = pcVar7;
      break;
    default:
      goto switchD_00281515_caseD_42;
    case 'C':
      fread_word(fp);
      if (pRVar6->cabal != 0) {
        bugout("Load_rooms: duplicate cabal fields.");
      }
      fread_word(fp);
      iVar4 = cabal_lookup(fread_word::word);
      pRVar6->cabal = (short)iVar4;
      break;
    case 'D':
      fread_word(fp);
      uVar5 = flag_lookup(fread_word::word,direction_table);
      if (5 < uVar5) {
        fmt_01._M_str = "Fread_rooms: vnum {} has bad door number.";
        fmt_01._M_len = 0x29;
        CLogger::Error<short&>((CLogger *)&RS.field_0x140,fmt_01,&local_124c);
        exit(1);
      }
      pEVar8 = (EXIT_DATA *)operator_new(0x50);
      iVar4 = fread_number(fp);
      (pEVar8->u1).vnum = (short)iVar4;
      fread_flag_new(pEVar8->exit_info,fp);
      iVar4 = fread_number(fp);
      pEVar8->key = (short)iVar4;
      pcVar7 = fread_string(fp);
      pEVar8->keyword = pcVar7;
      pcVar7 = fread_string(fp);
      pEVar8->description = pcVar7;
      local_1240[uVar5] = pEVar8;
      top_exit = top_exit + 1;
      break;
    case 'E':
      pEVar11 = (EXTRA_DESCR_DATA *)operator_new(0x20);
      pcVar7 = fread_string(fp);
      pEVar11->keyword = pcVar7;
      pcVar7 = fread_string(fp);
      pEVar11->description = pcVar7;
      pEVar11->next = pRVar6->extra_descr;
      pRVar6->extra_descr = pEVar11;
      top_ed = top_ed + 1;
      break;
    case 'G':
      iVar4 = fread_number(fp);
      pRVar6->guild = (short)iVar4;
      break;
    case 'H':
      iVar4 = fread_number(fp);
      pRVar6->heal_rate = (short)iVar4;
      break;
    case 'M':
      iVar4 = fread_number(fp);
      pRVar6->mana_rate = (short)iVar4;
      break;
    case 'O':
      fread_word(fp);
      if (*pRVar6->owner != '\0') {
        bugout("Load_rooms: duplicate owner.");
      }
      pcVar7 = fread_string(fp);
      pRVar6->owner = pcVar7;
      break;
    case 'R':
      fread_word(fp);
      fread_word(fp);
      iVar4 = flag_lookup(fread_word::word,room_flags);
      if (iVar4 == -99) {
        lVar14 = 0;
        while( true ) {
          cVar3 = fread_word::word[lVar14];
          if (cVar3 == '\0') {
            cVar3 = " dark"[lVar14 + 1];
            iVar12 = 0;
            if (cVar3 == '\0') goto LAB_002817d9;
          }
          else {
            iVar12 = cVar3 + 0x20;
            if (0x19 < (byte)(cVar3 + 0xbfU)) {
              iVar12 = (int)cVar3;
            }
            cVar3 = " dark"[lVar14 + 1];
          }
          iVar13 = cVar3 + 0x20;
          if (0x19 < (byte)(cVar3 + 0xbfU)) {
            iVar13 = (int)cVar3;
          }
          if (iVar12 != iVar13) break;
          lVar14 = lVar14 + 1;
        }
        bugout("Invalid bitvector specified for room flags.");
      }
LAB_002817d9:
      dVar1 = exp2((double)(iVar4 % 0x20));
      if (iVar4 < 0) {
        iVar4 = iVar4 + 0x1f;
      }
      local_1248[iVar4 >> 5] = local_1248[iVar4 >> 5] | (long)dVar1;
      break;
    case 'S':
      goto switchD_00281515_caseD_53;
    case 'T':
      fread_word(fp);
      pTVar10 = new_trap();
      pTVar10->room = pRVar6;
      fread_word(fp);
      iVar4 = flag_lookup(fread_word::word,trap_table);
      pTVar10->type = iVar4;
      iVar4 = fread_number(fp);
      if (9 < iVar4) {
        iVar4 = 10;
      }
      pTVar10->quality = iVar4;
      iVar4 = fread_number(fp);
      pTVar10->complexity = iVar4;
      iVar4 = fread_number(fp);
      if (iVar4 < 1) {
        iVar4 = 0;
      }
      pTVar10->timer = iVar4;
      pcVar7 = fread_string(fp);
      pTVar10->trig_echo = pcVar7;
      pcVar7 = fread_string(fp);
      pTVar10->exec_echo = pcVar7;
      pTVar10->armed = true;
      pRVar6->trap = pTVar10;
    }
  } while( true );
switchD_00281515_caseD_42:
  ungetc((int)cVar3,(FILE *)fp);
switchD_00281515_caseD_53:
  pRVar6->next = room_index_hash[local_124c % 0x400];
  room_index_hash[local_124c % 0x400] = pRVar6;
  pRVar6->next_room = room_list;
  top_room = top_room + 1;
  local_124c = 0;
  room_list = pRVar6;
  local_1249 = fread_letter(fp);
  if (local_1249 != '#') goto LAB_00281896;
  goto LAB_00281310;
}

Assistant:

void load_rooms(FILE *fp)
{
	ROOM_INDEX_DATA *pRoomIndex;
	char error_v[MAX_STRING_LENGTH];
	int i;

	if (area_last == nullptr)
		bugout("Load_resets: no #AREA seen yet.");

	for (;;)
	{
		short vnum = 0;
		char letter;
		char *bword;
		long bitvect;
		int door;
		int iHash;

		letter = fread_letter(fp);
		if (letter != '#')
		{
			RS.Logger.Error("Letter is {}.", letter);
			RS.Logger.Error("Load_newrooms: # not found, last vnum {}.", vnum);
			exit(0);
		}

		vnum = fread_number(fp);
		if (vnum == 0)
			break;

		fBootDb= false;

		if (get_room_index(vnum) != nullptr)
		{
			sprintf(error_v, "Load_rooms: vnum %d duplicated.", vnum);
			bugout(error_v);
		}

		fBootDb = true;

		pRoomIndex = new ROOM_INDEX_DATA;
		pRoomIndex->reset_first = nullptr;
		pRoomIndex->reset_last = nullptr;
		pRoomIndex->owner = palloc_string("");
		pRoomIndex->move_progs= false;
		pRoomIndex->people = nullptr;
		pRoomIndex->contents = nullptr;
		pRoomIndex->extra_descr = nullptr;
		pRoomIndex->alt_description = nullptr;
		pRoomIndex->alt_description_cond = 0;
		pRoomIndex->alt_name = nullptr;
		pRoomIndex->trap = nullptr;
		pRoomIndex->affected = nullptr;
		zero_vector(pRoomIndex->room_flags);

		for (i = 0; i < MAX_TRACKS; i++)
		{
			pRoomIndex->tracks[i] = new_track_data();
		}

		pRoomIndex->area = area_last;
		pRoomIndex->vnum = vnum;
		pRoomIndex->name = fread_string(fp);

		if (pRoomIndex->name[strlen(pRoomIndex->name) - 1] == '.')
			chop(pRoomIndex->name);

		pRoomIndex->description = fread_string(fp);
		pRoomIndex->sector_type = sect_table[sect_lookup(fread_word(fp))].value;

		/* Morg - Valgrind fix. */
		pRoomIndex->rprogs = nullptr;
		zero_vector(pRoomIndex->progtypes);
		pRoomIndex->cabal = 0;
		pRoomIndex->has_rune= false;

		zero_vector(pRoomIndex->affected_by);
		if (pRoomIndex->area->area_type == ARE_SHRINE)
		{
			SET_BIT(pRoomIndex->room_flags, ROOM_NO_SUMMON_TO);
			SET_BIT(pRoomIndex->room_flags, ROOM_NO_SUMMON_FROM);
			SET_BIT(pRoomIndex->room_flags, ROOM_NO_GATE);
		}

		auto pRoomIndex_exit_size = std::size(pRoomIndex->exit);
		for (door = 0; door < pRoomIndex_exit_size; door++)
		{
			pRoomIndex->exit[door] = nullptr;
		}

		/* defaults */
		pRoomIndex->heal_rate = 100;
		pRoomIndex->mana_rate = 100;
		pRoomIndex->light = 0;

		for (;;)
		{
			letter = fread_letter(fp);
			letter = UPPER(letter);
			if (letter == 'S')
				break;

			if (letter == 'H') /* healing room */
				pRoomIndex->heal_rate = fread_number(fp);
			else if (letter == 'M') /* mana room */
				pRoomIndex->mana_rate = fread_number(fp);
			else if (letter == 'G') /* Guilds...added by Ceran */
				pRoomIndex->guild = fread_number(fp);
			else if (letter == 'A') // ALTDESC
			{
				fread_word(fp);
				pRoomIndex->alt_description_cond = fread_number(fp);
				pRoomIndex->alt_name = fread_string(fp);
				pRoomIndex->alt_description = fread_string(fp);
			}
			else if (letter == 'C') /* Cabal */
			{
				fread_word(fp);
				if (pRoomIndex->cabal)
					bugout("Load_rooms: duplicate cabal fields.");
				pRoomIndex->cabal = cabal_lookup(fread_word(fp));
			}
			else if (letter == 'D')
			{
				EXIT_DATA *pexit;

				door = flag_lookup(fread_word(fp), direction_table);
				if (door < 0 || door > 5)
				{
					RS.Logger.Error("Fread_rooms: vnum {} has bad door number.", vnum);
					exit(1);
				}

				pexit = new EXIT_DATA;
				pexit->u1.vnum = fread_number(fp);
				fread_flag_new(pexit->exit_info, fp);
				pexit->key = fread_number(fp);
				pexit->keyword = fread_string(fp);
				pexit->description = fread_string(fp);

				pRoomIndex->exit[door] = pexit;
				top_exit++;
			}
			else if (letter == 'E')
			{
				EXTRA_DESCR_DATA *ed;

				ed = new EXTRA_DESCR_DATA;
				ed->keyword = fread_string(fp);
				ed->description = fread_string(fp);
				ed->next = pRoomIndex->extra_descr;
				pRoomIndex->extra_descr = ed;
				top_ed++;
			}
			else if (letter == 'T')
			{
				TRAP_DATA *trap;
				fread_word(fp);

				trap = new_trap();
				trap->room = pRoomIndex;
				trap->type = flag_lookup(fread_word(fp), trap_table);
				trap->quality = fread_number(fp);

				if (trap->quality > 10)
					trap->quality = 10;

				trap->complexity = fread_number(fp);
				trap->timer = fread_number(fp);

				if (trap->timer < 0)
					trap->timer = 0;

				trap->trig_echo = fread_string(fp);
				trap->exec_echo = fread_string(fp);
				trap->armed = true;
				pRoomIndex->trap = trap;
			}
			else if (letter == 'O')
			{
				fread_word(fp);

				if (pRoomIndex->owner[0] != '\0')
					bugout("Load_rooms: duplicate owner.");

				pRoomIndex->owner = fread_string(fp);
			}
			else if (letter == 'R')
			{
				fread_word(fp);
				bword = fread_word(fp);
				bitvect = flag_lookup(bword, room_flags);
				if (bitvect == NO_FLAG && str_cmp(bword, "dark"))
					bugout("Invalid bitvector specified for room flags.");
				SET_BIT(pRoomIndex->room_flags, bitvect);
			}
			else
			{
				ungetc(letter, fp);
				break;
			}
		}

		iHash = vnum % MAX_KEY_HASH;
		pRoomIndex->next = room_index_hash[iHash];
		room_index_hash[iHash] = pRoomIndex;
		pRoomIndex->next_room = room_list;
		room_list = pRoomIndex;
		top_room++;
	}
}